

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

upb_StringView jsondec_string(jsondec *d)

{
  byte bVar1;
  uint32_t cp;
  uint32_t uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  upb_StringView uVar7;
  char *end;
  char *buf_end;
  char *buf;
  byte *local_48;
  byte *local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_48 = (byte *)0x0;
  local_40 = (byte *)0x0;
  jsondec_skipws(d);
  pcVar6 = d->ptr;
  pbVar4 = (byte *)(pcVar6 + 1);
  d->ptr = (char *)pbVar4;
  if (*pcVar6 == '\"') {
    if (pbVar4 < d->end) {
      pbVar5 = (byte *)0x0;
      do {
        d->ptr = (char *)(pbVar4 + 1);
        bVar1 = *pbVar4;
        if (pbVar5 == local_40) {
          jsondec_resize(d,&local_38,(char **)&local_48,(char **)&local_40);
        }
        if (bVar1 == 0x5c) {
          pbVar4 = (byte *)d->ptr;
          if (pbVar4 == (byte *)d->end) break;
          bVar1 = *pbVar4;
          d->ptr = (char *)(pbVar4 + 1);
          if (bVar1 == 0x75) {
            if ((long)local_40 - (long)local_48 < 4) {
              jsondec_resize(d,&local_38,(char **)&local_48,(char **)&local_40);
            }
            pbVar4 = local_48;
            cp = jsondec_codepoint(d);
            if ((cp & 0xfffffc00) == 0xd800) {
              jsondec_parselit(d,"\\u");
              uVar2 = jsondec_codepoint(d);
              if ((uVar2 & 0xfffffc00) != 0xdc00) {
                pcVar6 = "Invalid low surrogate";
                goto LAB_002ef582;
              }
              cp = (cp & 0x3ff) * 0x400 + (uVar2 & 0x3ff) + 0x10000;
            }
            else if ((cp & 0xfffffc00) == 0xdc00) {
              pcVar6 = "Unpaired low surrogate";
              goto LAB_002ef582;
            }
            iVar3 = upb_Unicode_ToUTF8(cp,(char *)pbVar4);
            if (iVar3 == 0) {
              pcVar6 = "Invalid codepoint";
              goto LAB_002ef582;
            }
            local_48 = pbVar4 + iVar3;
          }
          else {
            bVar1 = *pbVar4;
            if (bVar1 < 0x66) {
              if ((0x3a < bVar1 - 0x22) ||
                 ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)) {
                if (bVar1 != 0x62) goto LAB_002ef58a;
                bVar1 = 8;
              }
            }
            else if (bVar1 < 0x72) {
              if (bVar1 == 0x66) {
                bVar1 = 0xc;
              }
              else {
                if (bVar1 != 0x6e) {
LAB_002ef58a:
                  pcVar6 = "Invalid escape char";
                  goto LAB_002ef582;
                }
                bVar1 = 10;
              }
            }
            else if (bVar1 == 0x72) {
              bVar1 = 0xd;
            }
            else {
              if (bVar1 != 0x74) goto LAB_002ef58a;
              bVar1 = 9;
            }
            *local_48 = bVar1;
            local_48 = local_48 + 1;
          }
        }
        else {
          if (bVar1 == 0x22) {
            *local_48 = 0;
            uVar7.size = (long)local_48 - (long)local_38;
            uVar7.data = local_38;
            return uVar7;
          }
          if (bVar1 < 0x20) {
            pcVar6 = "Invalid char in JSON string";
            goto LAB_002ef582;
          }
          *local_48 = bVar1;
          local_48 = local_48 + 1;
        }
        pbVar4 = (byte *)d->ptr;
        pbVar5 = local_48;
      } while (pbVar4 < d->end);
    }
    pcVar6 = "EOF inside string";
  }
  else {
    pcVar6 = "Expected string";
  }
LAB_002ef582:
  jsondec_err(d,pcVar6);
}

Assistant:

static upb_StringView jsondec_string(jsondec* d) {
  char* buf = NULL;
  char* end = NULL;
  char* buf_end = NULL;

  jsondec_skipws(d);

  if (*d->ptr++ != '"') {
    jsondec_err(d, "Expected string");
  }

  while (d->ptr < d->end) {
    char ch = *d->ptr++;

    if (end == buf_end) {
      jsondec_resize(d, &buf, &end, &buf_end);
    }

    switch (ch) {
      case '"': {
        upb_StringView ret;
        ret.data = buf;
        ret.size = end - buf;
        *end = '\0'; /* Needed for possible strtod(). */
        return ret;
      }
      case '\\':
        if (d->ptr == d->end) goto eof;
        if (*d->ptr == 'u') {
          d->ptr++;
          if (buf_end - end < 4) {
            /* Allow space for maximum-sized codepoint (4 bytes). */
            jsondec_resize(d, &buf, &end, &buf_end);
          }
          end += jsondec_unicode(d, end);
        } else {
          *end++ = jsondec_escape(d);
        }
        break;
      default:
        if ((unsigned char)ch < 0x20) {
          jsondec_err(d, "Invalid char in JSON string");
        }
        *end++ = ch;
        break;
    }
  }

eof:
  jsondec_err(d, "EOF inside string");
}